

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall libwebm::VpxPesParser::Open(VpxPesParser *this,string *pes_file)

{
  size_type sVar1;
  int iVar2;
  uint64_t uVar3;
  char *__filename;
  FILE *pFVar4;
  size_type sVar5;
  value_type local_3d [13];
  int local_30;
  FILEDeleter local_29;
  int byte;
  FilePtr file;
  string *pes_file_local;
  VpxPesParser *this_local;
  
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_IO_FILE,_libwebm::FILEDeleter,_true,_true>)
                 (__uniq_ptr_data<_IO_FILE,_libwebm::FILEDeleter,_true,_true>)pes_file;
  uVar3 = GetFileSize(pes_file);
  *(uint64_t *)(this + 0x38) = uVar3;
  if (*(long *)(this + 0x38) == 0) {
    return false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
             *(size_type *)(this + 0x38));
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar4 = fopen(__filename,"rb");
  std::unique_ptr<_IO_FILE,libwebm::FILEDeleter>::unique_ptr<libwebm::FILEDeleter,void>
            ((unique_ptr<_IO_FILE,libwebm::FILEDeleter> *)&byte,(pointer)pFVar4,&local_29);
  while( true ) {
    pFVar4 = (FILE *)std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::get
                               ((unique_ptr<_IO_FILE,_libwebm::FILEDeleter> *)&byte);
    local_30 = fgetc(pFVar4);
    if (local_30 == -1) break;
    local_3d[0] = (value_type)local_30;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),local_3d);
  }
  pFVar4 = (FILE *)std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::get
                             ((unique_ptr<_IO_FILE,_libwebm::FILEDeleter> *)&byte);
  iVar2 = feof(pFVar4);
  if (iVar2 != 0) {
    pFVar4 = (FILE *)std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::get
                               ((unique_ptr<_IO_FILE,_libwebm::FILEDeleter> *)&byte);
    iVar2 = ferror(pFVar4);
    if ((iVar2 == 0) &&
       (sVar1 = *(size_type *)(this + 0x38),
       sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58)),
       sVar1 == sVar5)) {
      *(undefined8 *)(this + 0x70) = 0;
      *(undefined4 *)(this + 0x78) = 0;
      this_local._7_1_ = true;
      goto LAB_00117a66;
    }
  }
  this_local._7_1_ = false;
LAB_00117a66:
  std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::~unique_ptr
            ((unique_ptr<_IO_FILE,_libwebm::FILEDeleter> *)&byte);
  return this_local._7_1_;
}

Assistant:

bool VpxPesParser::Open(const std::string& pes_file) {
  pes_file_size_ = static_cast<size_t>(libwebm::GetFileSize(pes_file));
  if (pes_file_size_ <= 0)
    return false;
  pes_file_data_.reserve(static_cast<size_t>(pes_file_size_));
  libwebm::FilePtr file = libwebm::FilePtr(std::fopen(pes_file.c_str(), "rb"),
                                           libwebm::FILEDeleter());
  int byte;
  while ((byte = fgetc(file.get())) != EOF) {
    pes_file_data_.push_back(static_cast<std::uint8_t>(byte));
  }

  if (!feof(file.get()) || ferror(file.get()) ||
      pes_file_size_ != pes_file_data_.size()) {
    return false;
  }

  read_pos_ = 0;
  parse_state_ = kFindStartCode;
  return true;
}